

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

string * __thiscall
CMU462::Application::info_abi_cxx11_(string *__return_storage_ptr__,Application *this)

{
  string *psVar1;
  allocator local_9;
  
  if (this->noGUI == true) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
    return __return_storage_ptr__;
  }
  psVar1 = (string *)
           (*(code *)(&DAT_001f1008 +
                     *(int *)(&DAT_001f1008 + (ulong)*(uint *)&(this->super_Renderer).field_0xc * 4)
                     ))();
  return psVar1;
}

Assistant:

string Application::info() {
  if(noGUI) { return ""; }
  switch (mode) {
    case MODEL_MODE:
      return "MeshEdit";
      break;
    case ANIMATE_MODE:
      return "Animation";
      break;
    case RENDER_MODE:
    case VISUALIZE_MODE:
      return "PathTracer";
      break;
  }
}